

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O3

amqp_table_entry_t * amqp_table_get_entry_by_key(amqp_table_t *table,amqp_bytes_t key)

{
  int iVar1;
  long lVar2;
  long lVar3;
  amqp_bytes_t r;
  
  if (0 < table->num_entries) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      r.bytes = *(void **)((long)&(table->entries->key).bytes + lVar3);
      r.len = *(size_t *)((long)&(table->entries->key).len + lVar3);
      iVar1 = amqp_bytes_equal(r,key);
      if (iVar1 != 0) {
        return (amqp_table_entry_t *)((long)&(table->entries->key).len + lVar3);
      }
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x28;
    } while (lVar2 < table->num_entries);
  }
  return (amqp_table_entry_t *)0x0;
}

Assistant:

amqp_table_entry_t *amqp_table_get_entry_by_key(const amqp_table_t *table,
                                                const amqp_bytes_t key) {
  int i;
  assert(table != NULL);
  for (i = 0; i < table->num_entries; ++i) {
    if (amqp_bytes_equal(table->entries[i].key, key)) {
      return &table->entries[i];
    }
  }
  return NULL;
}